

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall xmrig::Client::deleteLater(Client *this)

{
  ulong uVar1;
  int iVar2;
  mapped_type *ppCVar3;
  long lVar4;
  _Base_ptr p_Var5;
  long lVar6;
  _Base_ptr p_Var7;
  mapped_type pCVar8;
  iterator __position;
  bool bVar9;
  ulong local_18;
  
  if ((this->super_BaseClient).m_listener != (IClientListener *)0x0) {
    (this->super_BaseClient).m_listener = (IClientListener *)0x0;
    iVar2 = (*(this->super_BaseClient).super_IClient._vptr_IClient[2])();
    if ((char)iVar2 == '\0') {
      uVar1 = this->m_key;
      lVar4 = 0x1b18e0;
      if (m_storage._16_8_ != 0) {
        lVar4 = 0x1b18e0;
        lVar6 = m_storage._16_8_;
        do {
          bVar9 = *(ulong *)(lVar6 + 0x20) < uVar1;
          if (!bVar9) {
            lVar4 = lVar6;
          }
          lVar6 = *(long *)(lVar6 + 0x10 + (ulong)bVar9 * 8);
        } while (lVar6 != 0);
      }
      local_18 = uVar1;
      if ((lVar4 == 0x1b18e0) || (uVar1 < *(ulong *)(lVar4 + 0x20))) {
        pCVar8 = (mapped_type)0x0;
      }
      else {
        ppCVar3 = std::
                  map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
                  ::at((map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
                        *)m_storage,&local_18);
        pCVar8 = *ppCVar3;
      }
      if (pCVar8 != (mapped_type)0x0) {
        p_Var5 = (_Base_ptr)(m_storage + 8);
        if (m_storage._16_8_ != 0) {
          p_Var5 = (_Base_ptr)(m_storage + 8);
          p_Var7 = (_Base_ptr)m_storage._16_8_;
          do {
            if (*(ulong *)(p_Var7 + 1) >= uVar1) {
              p_Var5 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < uVar1];
          } while (p_Var7 != (_Base_ptr)0x0);
        }
        __position._M_node = (_Base_ptr)(m_storage + 8);
        if ((p_Var5 != (_Base_ptr)(m_storage + 8)) &&
           (__position._M_node = (_Base_ptr)(m_storage + 8), *(ulong *)(p_Var5 + 1) <= uVar1)) {
          __position._M_node = p_Var5;
        }
        if (__position._M_node != (_Base_ptr)(m_storage + 8)) {
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::Client*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::Client*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::Client*>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::Client*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::Client*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::Client*>>>
                              *)m_storage,__position);
        }
        (*(pCVar8->super_BaseClient).super_IClient._vptr_IClient[1])(pCVar8);
      }
    }
  }
  return;
}

Assistant:

void xmrig::Client::deleteLater()
{
    if (!m_listener) {
        return;
    }

    m_listener = nullptr;

    if (!disconnect()) {
        m_storage.remove(m_key);
    }
}